

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Params *params)

{
  pointer *ppAVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  EnumValueDescriptor *pEVar3;
  long lVar4;
  long lVar5;
  EnumValueDescriptor *value;
  Alias alias;
  EnumValueDescriptor *local_48;
  Alias local_40;
  
  this->params_ = params;
  this->descriptor_ = descriptor;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_48 = (EnumValueDescriptor *)(*(long *)(descriptor + 0x30) + lVar4);
      pEVar3 = EnumDescriptor::FindValueByNumber
                         (descriptor,*(int *)(*(long *)(descriptor + 0x30) + 0x10 + lVar4));
      if (local_48 == pEVar3) {
        __position_00._M_current =
             (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                    ((vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
                      *)&this->canonical_values_,__position_00,&local_48);
        }
        else {
          *__position_00._M_current = local_48;
          pppEVar2 = &(this->canonical_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
        }
      }
      else {
        local_40.value = local_48;
        __position._M_current =
             (this->aliases_).
             super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_40.canonical_value = pEVar3;
        if (__position._M_current ==
            (this->aliases_).
            super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>>
          ::_M_realloc_insert<google::protobuf::compiler::javanano::EnumGenerator::Alias_const&>
                    ((vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>>
                      *)&this->aliases_,__position,&local_40);
        }
        else {
          (__position._M_current)->value = local_48;
          (__position._M_current)->canonical_value = pEVar3;
          ppAVar1 = &(this->aliases_).
                     super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      lVar5 = lVar5 + 1;
      descriptor = this->descriptor_;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < *(int *)(descriptor + 0x2c));
  }
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor, const Params& params)
  : params_(params), descriptor_(descriptor) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
      descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}